

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.h
# Opt level: O3

void __thiscall PathAlias::PathAlias(PathAlias *this,char *path)

{
  string local_40;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,path,&local_19);
  PathAlias(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

PathAlias(const char* path) : PathAlias(std::string(path)) {}